

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

void Cmd::ltrim(string *s)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<Cmd::ltrim(std::__cxx11::string&)::_lambda(unsigned_char)_1_>>
                    (pcVar1,pcVar1 + s->_M_string_length);
  std::__cxx11::string::erase(s,pcVar1,_Var2._M_current);
  return;
}

Assistant:

static void ltrim(std::string &s) {
		s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](unsigned char ch) { return !std::isspace(ch); }));
	}